

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O1

void png_do_strip_channel(png_row_infop row_info,png_bytep row,int at_start)

{
  png_byte *ppVar1;
  size_t sVar2;
  png_byte *ppVar3;
  png_byte pVar4;
  png_byte *ppVar5;
  png_bytep sp;
  long lVar6;
  
  sVar2 = row_info->rowbytes;
  ppVar1 = row + sVar2;
  ppVar3 = row;
  if (row_info->channels == '\x04') {
    if (row_info->bit_depth == '\x10') {
      ppVar3 = row + 6;
      if (at_start != 0) {
        ppVar3 = row;
      }
      lVar6 = 2;
      if (at_start == 0) {
        lVar6 = 8;
      }
      pVar4 = '0';
      if (lVar6 < (long)sVar2) {
        ppVar5 = row + lVar6;
        do {
          *ppVar3 = *ppVar5;
          ppVar3[1] = ppVar5[1];
          ppVar3[2] = ppVar5[2];
          ppVar3[3] = ppVar5[3];
          ppVar3[4] = ppVar5[4];
          ppVar3[5] = ppVar5[5];
          ppVar3 = ppVar3 + 6;
          ppVar5 = ppVar5 + 8;
        } while (ppVar5 < ppVar1);
      }
    }
    else {
      if (row_info->bit_depth != '\b') {
        return;
      }
      ppVar3 = row + (ulong)(at_start == 0) * 3;
      lVar6 = (ulong)(at_start == 0) * 3 + 1;
      pVar4 = '\x18';
      if (lVar6 < (long)sVar2) {
        ppVar5 = row + lVar6;
        do {
          *ppVar3 = *ppVar5;
          ppVar3[1] = ppVar5[1];
          ppVar3[2] = ppVar5[2];
          ppVar3 = ppVar3 + 3;
          ppVar5 = ppVar5 + 4;
        } while (ppVar5 < ppVar1);
      }
    }
    row_info->pixel_depth = pVar4;
    row_info->channels = '\x03';
    if (row_info->color_type == '\x06') {
      row_info->color_type = '\x02';
    }
  }
  else {
    if (row_info->channels != '\x02') {
      return;
    }
    pVar4 = row_info->bit_depth;
    if (pVar4 == '\x10') {
      if (at_start == 0) {
        ppVar3 = row + 2;
      }
      ppVar5 = row + 4;
      if (at_start != 0) {
        ppVar5 = row + 2;
      }
      for (; ppVar5 < ppVar1; ppVar5 = ppVar5 + 4) {
        *ppVar3 = *ppVar5;
        ppVar3[1] = ppVar5[1];
        ppVar3 = ppVar3 + 2;
      }
    }
    else {
      if (pVar4 != '\b') {
        return;
      }
      if (at_start == 0) {
        ppVar3 = row + 1;
      }
      ppVar5 = row + 2;
      if (at_start != 0) {
        ppVar5 = row + 1;
      }
      for (; ppVar5 < ppVar1; ppVar5 = ppVar5 + 2) {
        *ppVar3 = *ppVar5;
        ppVar3 = ppVar3 + 1;
      }
    }
    row_info->pixel_depth = pVar4;
    row_info->channels = '\x01';
    if (row_info->color_type == '\x04') {
      row_info->color_type = '\0';
    }
  }
  row_info->rowbytes = (long)ppVar3 - (long)row;
  return;
}

Assistant:

void /* PRIVATE */
png_do_strip_channel(png_row_infop row_info, png_bytep row, int at_start)
{
   png_bytep sp = row; /* source pointer */
   png_bytep dp = row; /* destination pointer */
   png_bytep ep = row + row_info->rowbytes; /* One beyond end of row */

   /* At the start sp will point to the first byte to copy and dp to where
    * it is copied to.  ep always points just beyond the end of the row, so
    * the loop simply copies (channels-1) channels until sp reaches ep.
    *
    * at_start:        0 -- convert AG, XG, ARGB, XRGB, AAGG, XXGG, etc.
    *            nonzero -- convert GA, GX, RGBA, RGBX, GGAA, RRGGBBXX, etc.
    */

   /* GA, GX, XG cases */
   if (row_info->channels == 2)
   {
      if (row_info->bit_depth == 8)
      {
         if (at_start != 0) /* Skip initial filler */
            ++sp;
         else          /* Skip initial channel and, for sp, the filler */
         {
            sp += 2; ++dp;
         }

         /* For a 1 pixel wide image there is nothing to do */
         while (sp < ep)
         {
            *dp++ = *sp; sp += 2;
         }

         row_info->pixel_depth = 8;
      }

      else if (row_info->bit_depth == 16)
      {
         if (at_start != 0) /* Skip initial filler */
            sp += 2;
         else          /* Skip initial channel and, for sp, the filler */
         {
            sp += 4; dp += 2;
         }

         while (sp < ep)
         {
            *dp++ = *sp++; *dp++ = *sp; sp += 3;
         }

         row_info->pixel_depth = 16;
      }

      else
         return; /* bad bit depth */

      row_info->channels = 1;

      /* Finally fix the color type if it records an alpha channel */
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
         row_info->color_type = PNG_COLOR_TYPE_GRAY;
   }

   /* RGBA, RGBX, XRGB cases */
   else if (row_info->channels == 4)
   {
      if (row_info->bit_depth == 8)
      {
         if (at_start != 0) /* Skip initial filler */
            ++sp;
         else          /* Skip initial channels and, for sp, the filler */
         {
            sp += 4; dp += 3;
         }

         /* Note that the loop adds 3 to dp and 4 to sp each time. */
         while (sp < ep)
         {
            *dp++ = *sp++; *dp++ = *sp++; *dp++ = *sp; sp += 2;
         }

         row_info->pixel_depth = 24;
      }

      else if (row_info->bit_depth == 16)
      {
         if (at_start != 0) /* Skip initial filler */
            sp += 2;
         else          /* Skip initial channels and, for sp, the filler */
         {
            sp += 8; dp += 6;
         }

         while (sp < ep)
         {
            /* Copy 6 bytes, skip 2 */
            *dp++ = *sp++; *dp++ = *sp++;
            *dp++ = *sp++; *dp++ = *sp++;
            *dp++ = *sp++; *dp++ = *sp; sp += 3;
         }

         row_info->pixel_depth = 48;
      }

      else
         return; /* bad bit depth */

      row_info->channels = 3;

      /* Finally fix the color type if it records an alpha channel */
      if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
         row_info->color_type = PNG_COLOR_TYPE_RGB;
   }

   else
      return; /* The filler channel has gone already */

   /* Fix the rowbytes value. */
   row_info->rowbytes = (size_t)(dp-row);
}